

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char buf [64];
  int iVar17;
  int local_8c;
  ImVec2 local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  if (((flags & 0x700000U) == 0 || (flags & 0x1800000U) == 0) &&
     (bVar5 = BeginPopup("context",0), bVar5)) {
    local_80 = GImGui;
    uVar7 = GImGui->ColorEditOptions;
    if ((flags & 0x700000U) == 0) {
      bVar5 = RadioButton("RGB",(bool)((byte)(uVar7 >> 0x14) & 1));
      uVar6 = (uVar7 & 0xff8fffff) + 0x100000;
      if (!bVar5) {
        uVar6 = uVar7;
      }
      bVar5 = RadioButton("HSV",(bool)((byte)(uVar6 >> 0x15) & 1));
      uVar7 = uVar7 & 0xff8fffff | 0x200000;
      if (!bVar5) {
        uVar7 = uVar6;
      }
      bVar5 = RadioButton("Hex",(bool)((byte)(uVar7 >> 0x16) & 1));
      if (bVar5) {
        uVar7 = uVar7 & 0xff8fffff | 0x400000;
      }
    }
    if ((flags & 0x1800000U) == 0) {
      if (((flags & 0x700000U) == 0) && (GImGui->CurrentWindow->SkipItems == false)) {
        SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
      }
      bVar5 = RadioButton("0..255",(bool)((byte)(uVar7 >> 0x17) & 1));
      uVar6 = (uVar7 & 0xfe7fffff) + 0x800000;
      if (!bVar5) {
        uVar6 = uVar7;
      }
      bVar5 = RadioButton("0.00..1.00",(bool)((byte)(uVar6 >> 0x18) & 1));
      uVar7 = uVar7 & 0xfe7fffff | 0x1000000;
      if (!bVar5) {
        uVar7 = uVar6;
      }
    }
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
    local_78[0] = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
    bVar5 = ButtonEx("Copy as..",local_78,0);
    if (bVar5) {
      OpenPopup("Copy",0);
    }
    bVar5 = BeginPopup("Copy",0);
    if (bVar5) {
      fVar1 = *col;
      fVar2 = col[1];
      auVar16 = SUB6416(ZEXT464(0x3f800000),0);
      auVar12 = vminss_avx(auVar16,ZEXT416((uint)fVar1));
      auVar13 = ZEXT816(0) << 0x40;
      uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar13,1);
      auVar10._4_12_ = auVar12._4_12_;
      auVar10._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar12._0_4_;
      auVar12 = vminss_avx(auVar16,ZEXT416((uint)fVar2));
      uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar13,1);
      auVar11._4_12_ = auVar12._4_12_;
      auVar11._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar12._0_4_;
      fVar3 = col[2];
      auVar12 = vminss_avx(auVar16,ZEXT416((uint)fVar3));
      uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar3),auVar13,1);
      auVar12._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar12._0_4_;
      local_8c = 0xff;
      auVar15 = SUB6416(ZEXT464(0x437f0000),0);
      if ((flags & 2U) == 0) {
        auVar16 = vminss_avx(auVar16,ZEXT416((uint)col[3]));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)col[3]),auVar13,1);
        auVar13._4_12_ = auVar16._4_12_;
        auVar13._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar16._0_4_;
        auVar13 = vfmadd213ss_fma(auVar13,auVar15,ZEXT416(0x3f000000));
        local_8c = (int)auVar13._0_4_;
      }
      auVar13 = SUB6416(ZEXT464(0x3f000000),0);
      auVar10 = vfmadd213ss_fma(auVar10,auVar15,auVar13);
      auVar11 = vfmadd213ss_fma(auVar11,auVar15,auVar13);
      auVar12 = vfmadd213ss_fma(auVar12,auVar15,auVar13);
      if ((flags & 2U) == 0) {
        dVar14 = (double)col[3];
      }
      else {
        dVar14 = 1.0;
      }
      uVar6 = (uint)auVar10._0_4_;
      uVar8 = (uint)auVar11._0_4_;
      uVar9 = (uint)auVar12._0_4_;
      ImFormatString((char *)local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,
                     (double)fVar2,(double)fVar3,dVar14);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar5 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar5) {
        SetClipboardText((char *)local_78);
      }
      iVar17 = local_8c;
      ImFormatString((char *)local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar6,(ulong)uVar8,(ulong)uVar9,
                     local_8c);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar5 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar5) {
        SetClipboardText((char *)local_78);
      }
      ImFormatString((char *)local_78,0x40,"#%02X%02X%02X",(ulong)uVar6,(ulong)uVar8,(ulong)uVar9,
                     iVar17);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar5 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar5) {
        SetClipboardText((char *)local_78);
      }
      if ((flags & 2U) == 0) {
        ImFormatString((char *)local_78,0x40,"#%02X%02X%02X%02X",(ulong)uVar6,(ulong)uVar8,
                       (ulong)uVar9,local_8c);
        local_88.x = 0.0;
        local_88.y = 0.0;
        bVar5 = Selectable((char *)local_78,false,0,&local_88);
        if (bVar5) {
          SetClipboardText((char *)local_78);
        }
      }
      EndPopup();
    }
    local_80->ColorEditOptions = uVar7;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags_DisplayMask_);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags_DataTypeMask_);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}